

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unewdata.cpp
# Opt level: O0

void udata_writePadding(UNewDataMemory *pData,int32_t length)

{
  int local_14;
  int32_t length_local;
  UNewDataMemory *pData_local;
  
  if ((pData != (UNewDataMemory *)0x0) && (local_14 = length, pData->file != (FileStream *)0x0)) {
    for (; 0xf < local_14; local_14 = local_14 + -0x10) {
      T_FileStream_write(pData->file,udata_writePadding::padding,0x10);
    }
    if (0 < local_14) {
      T_FileStream_write(pData->file,udata_writePadding::padding,local_14);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
udata_writePadding(UNewDataMemory *pData, int32_t length) {
    static const uint8_t padding[16]={
        0xaa, 0xaa, 0xaa, 0xaa,
        0xaa, 0xaa, 0xaa, 0xaa,
        0xaa, 0xaa, 0xaa, 0xaa,
        0xaa, 0xaa, 0xaa, 0xaa
    };
    if(pData!=NULL && pData->file!=NULL) {
        while(length>=16) {
            T_FileStream_write(pData->file, padding, 16);
            length-=16;
        }
        if(length>0) {
            T_FileStream_write(pData->file, padding, length);
        }
    }
}